

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRenderRule * __thiscall
QStyleSheetStyle::renderRule
          (QRenderRule *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj,QStyleOption *opt
          ,int pseudoElement)

{
  SubControl SVar1;
  CheckType CVar2;
  SelectedPosition SVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  QStyleOptionComplex *pQVar8;
  QStyleOptionMenuItem *pQVar9;
  QStyleOptionHeader *pQVar10;
  QStyleOptionTabWidgetFrame *pQVar11;
  QStyleOptionComboBox *pQVar12;
  QStyleOptionSpinBox *pQVar13;
  QStyleOptionGroupBox *pQVar14;
  QStyleOptionTitleBar *pQVar15;
  QStyleOptionTab *pQVar16;
  QStyleOptionButton *pQVar17;
  QStyleOptionFrame *pQVar18;
  QStyleOptionToolBar *pQVar19;
  QStyleOptionToolBox *pQVar20;
  QStyleOptionDockWidget *pQVar21;
  QStyleOptionViewItem *pQVar22;
  QPlainTextEdit *this_00;
  QTextEdit *this_01;
  QLineEdit *this_02;
  QFrame *this_03;
  quint64 qVar23;
  QFlagsStorage<QStyle::StateFlag> QVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  QFlagsStorage<QStyle::StateFlag> state;
  
  if (opt == (QStyleOption *)0x0) {
    state.i = 0;
  }
  else {
    state.i = (opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
  }
  pQVar8 = qstyleoption_cast<QStyleOptionComplex_const*>(opt);
  if (pQVar8 == (QStyleOptionComplex *)0x0) {
    pQVar9 = qstyleoption_cast<QStyleOptionMenuItem_const*>(opt);
    if (pQVar9 == (QStyleOptionMenuItem *)0x0) {
      pQVar10 = qstyleoption_cast<QStyleOptionHeader_const*>(opt);
      if (pQVar10 == (QStyleOptionHeader *)0x0) {
        pQVar11 = qstyleoption_cast<QStyleOptionTabWidgetFrame_const*>(opt);
        if (pQVar11 == (QStyleOptionTabWidgetFrame *)0x0) {
          pQVar16 = qstyleoption_cast<QStyleOptionTab_const*>(opt);
          if (pQVar16 == (QStyleOptionTab *)0x0) {
            pQVar17 = qstyleoption_cast<QStyleOptionButton_const*>(opt);
            if (pQVar17 == (QStyleOptionButton *)0x0) {
              pQVar18 = qstyleoption_cast<QStyleOptionFrame_const*>(opt);
              if (pQVar18 == (QStyleOptionFrame *)0x0) {
                pQVar19 = qstyleoption_cast<QStyleOptionToolBar_const*>(opt);
                if (pQVar19 == (QStyleOptionToolBar *)0x0) {
                  pQVar20 = qstyleoption_cast<QStyleOptionToolBox_const*>(opt);
                  if (pQVar20 == (QStyleOptionToolBox *)0x0) {
                    pQVar21 = qstyleoption_cast<QStyleOptionDockWidget_const*>(opt);
                    if (pQVar21 == (QStyleOptionDockWidget *)0x0) {
                      pQVar22 = qstyleoption_cast<QStyleOptionViewItem_const*>(opt);
                      if (pQVar22 == (QStyleOptionViewItem *)0x0) {
                        this_00 = QtPrivate::
                                  qobject_cast_helper<QPlainTextEdit_const*,QObject_const>(obj);
                        if (this_00 == (QPlainTextEdit *)0x0) {
                          this_01 = QtPrivate::qobject_cast_helper<QTextEdit_const*,QObject_const>
                                              (obj);
                          if (this_01 == (QTextEdit *)0x0) goto LAB_0033e698;
                          bVar5 = QTextEdit::isReadOnly(this_01);
                        }
                        else {
                          bVar5 = QPlainTextEdit::isReadOnly(this_00);
                        }
                        uVar28 = 0x8000000000;
                        if (bVar5 != false) {
                          uVar28 = 0x40000000;
                        }
                      }
                      else {
                        uVar28 = (ulong)((pQVar22->features).
                                         super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
                                         .super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>
                                         .i & 2) << 0x2b;
                        switch(pQVar22->viewItemPosition) {
                        case Beginning:
                          goto switchD_0033e586_caseD_0;
                        case Middle:
                          goto switchD_0033e586_caseD_1;
                        case End:
                          goto switchD_0033e586_caseD_2;
                        case OnlyOne:
                          goto switchD_0033e586_caseD_3;
                        }
                      }
                    }
                    else {
                      uVar28 = ((ulong)pQVar21->movable << 0x21) +
                               ((ulong)pQVar21->floatable << 0x22 |
                               (ulong)pQVar21->closable << 0x20 |
                               (ulong)pQVar21->verticalTitleBar << 10) + 0x400;
                    }
                  }
                  else {
                    if ((ulong)pQVar20->position < 4) {
                      uVar28 = *(ulong *)(&DAT_005f6b80 + (ulong)pQVar20->position * 8);
                    }
                    else {
                      uVar28 = 0;
                    }
                    if (pQVar20->selectedPosition == PreviousIsSelected) goto LAB_0033e5f7;
                    if (pQVar20->selectedPosition == NextIsSelected) goto LAB_0033e5eb;
                  }
                }
                else {
                  uVar25 = pQVar19->toolBarArea - LeftToolBarArea;
                  if (uVar25 < 8) {
                    uVar28 = *(ulong *)(&DAT_005f5fa8 + (ulong)uVar25 * 8);
                  }
                  else {
                    uVar28 = 0;
                  }
                  switch(pQVar19->positionWithinLine) {
                  case Beginning:
switchD_0033e586_caseD_0:
                    uVar28 = uVar28 | 0x10000;
                    break;
                  case Middle:
switchD_0033e586_caseD_1:
                    uVar28 = uVar28 | 0x40000;
                    break;
                  case End:
switchD_0033e586_caseD_2:
                    uVar28 = uVar28 | 0x20000;
                    break;
                  case OnlyOne:
switchD_0033e586_caseD_3:
                    uVar28 = uVar28 | 0x80000;
                  }
                }
              }
              else {
                uVar28 = (ulong)(((pQVar18->features).
                                  super_QFlagsStorageHelper<QStyleOptionFrame::FrameFeature,_4>.
                                  super_QFlagsStorage<QStyleOptionFrame::FrameFeature>.i & 1) <<
                                 0x16 | (uint)(pQVar18->lineWidth == 0) << 0x1d);
              }
            }
            else {
              uVar25 = (pQVar17->features).
                       super_QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4>.
                       super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i;
              uVar28 = (ulong)((uVar25 & 4) << 0xd | (uVar25 & 1) << 0x16);
            }
          }
          else {
            if ((ulong)pQVar16->position < 4) {
              uVar28 = *(ulong *)(&DAT_005f6b80 + (ulong)pQVar16->position * 8);
            }
            else {
              uVar28 = 0;
            }
            if (pQVar16->selectedPosition == PreviousIsSelected) {
              uVar28 = uVar28 | 0x100000;
            }
            else if (pQVar16->selectedPosition == NextIsSelected) {
              uVar28 = uVar28 | 0x200000;
            }
            switch(pQVar16->shape) {
            case RoundedNorth:
            case TriangularNorth:
              uVar28 = uVar28 | 0x2000000;
              break;
            case RoundedSouth:
            case TriangularSouth:
              uVar28 = uVar28 | 0x4000000;
              break;
            case RoundedWest:
            case TriangularWest:
              uVar28 = uVar28 | 0x800000;
              break;
            case RoundedEast:
            case TriangularEast:
              uVar28 = uVar28 | 0x1000000;
            }
          }
        }
        else if ((ulong)pQVar11->shape < 8) {
          uVar28 = *(ulong *)(&DAT_005f5f68 + (ulong)pQVar11->shape * 8);
        }
        else {
LAB_0033e698:
          uVar28 = 0;
        }
      }
      else {
        if ((ulong)pQVar10->position < 4) {
          uVar28 = *(ulong *)(&DAT_005f6b80 + (ulong)pQVar10->position * 8);
        }
        else {
          uVar28 = 0;
        }
        SVar3 = pQVar10->selectedPosition;
        if (SVar3 == NextIsSelected) {
LAB_0033e5eb:
          uVar28 = uVar28 | 0x200000;
        }
        else if (SVar3 == PreviousIsSelected) {
LAB_0033e5f7:
          uVar28 = uVar28 | 0x100000;
        }
        else if (SVar3 == NextAndPreviousAreSelected) {
          uVar28 = uVar28 | 0x300000;
        }
      }
    }
    else {
      CVar2 = pQVar9->checkType;
      uVar28 = (ulong)(pQVar9->menuItemType == DefaultItem) << 0xf;
      if (CVar2 != NotCheckable) {
        if (CVar2 == NonExclusive) {
          uVar28 = uVar28 | 0x10000000;
        }
        else if (CVar2 == Exclusive) {
          uVar28 = uVar28 | 0x8000000;
        }
        uVar26 = 0x4000000040;
        if (pQVar9->checked != false) {
          uVar26 = 0x2000000020;
        }
        uVar28 = uVar28 | uVar26;
      }
    }
    this_02 = QtPrivate::qobject_cast_helper<QLineEdit_const*,QObject_const>(obj);
    if (this_02 == (QLineEdit *)0x0) {
      this_03 = QtPrivate::qobject_cast_helper<QFrame_const*,QObject_const>(obj);
      if (this_03 != (QFrame *)0x0) {
        iVar7 = QFrame::lineWidth(this_03);
        if (iVar7 == 0) {
          uVar28 = uVar28 | 0x20000000;
        }
      }
    }
    else {
      state.i = state.i & 0xfffffffb;
      bVar5 = QLineEdit::hasFrame(this_02);
      if (bVar5) {
        uVar28 = uVar28 & 0xffffffffdfffffff;
      }
      else {
        uVar28 = uVar28 | 0x20000000;
      }
    }
    goto LAB_0033e6f2;
  }
  if (pseudoElement == 0) goto switchD_0033e1d0_caseD_a;
  SVar1 = (pQVar8->activeSubControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
          super_QFlagsStorage<QStyle::SubControl>.i;
  uVar25 = state.i & 0x181;
  if ((knownPseudoElements[pseudoElement].subControl & SVar1) != SC_None) {
    uVar25 = state.i;
  }
  state.i = uVar25;
  switch(pseudoElement) {
  case 8:
  case 9:
    uVar6 = 0x2000020;
    goto LAB_0033e353;
  case 10:
  case 0x10:
    break;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    pQVar13 = qstyleoption_cast<QStyleOptionSpinBox_const*>(opt);
    if (pQVar13 != (QStyleOptionSpinBox *)0x0) {
      uVar6 = (pQVar13->stepEnabled).super_QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4>
              .super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i;
      uVar4 = 0x20;
      if ((uVar6 & 2) == 0) {
        uVar4 = 8;
      }
      if (pseudoElement - 0xbU < 2) {
        uVar4 = 8;
      }
      uVar27 = 0x20;
      if ((uVar6 & 1) == 0) {
        uVar27 = uVar4;
      }
      if (1 < pseudoElement - 0xbU) {
        uVar27 = uVar4;
      }
      state.i = uVar25 | uVar27;
    }
    break;
  case 0xf:
    uVar6 = 0x2004;
LAB_0033e353:
    state.i = uVar25 | uVar6 & (pQVar8->super_QStyleOption).state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i;
    break;
  case 0x11:
  case 0x12:
  case 0x13:
    uVar6 = (pQVar8->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    uVar25 = uVar6 & 0x2000 | uVar25;
    state.i = uVar25 | 4;
    if ((SVar1 & SC_ComboBoxEditField) == SC_None && (uVar6 & 4) == 0) {
      state.i = uVar25;
    }
    break;
  default:
    if (pseudoElement == 0x31) {
      uVar6 = 0x2000;
      goto LAB_0033e353;
    }
  }
switchD_0033e1d0_caseD_a:
  pQVar12 = qstyleoption_cast<QStyleOptionComboBox_const*>(opt);
  if (pQVar12 == (QStyleOptionComboBox *)0x0) {
    pQVar13 = qstyleoption_cast<QStyleOptionSpinBox_const*>(opt);
    if (pQVar13 == (QStyleOptionSpinBox *)0x0) {
      pQVar14 = qstyleoption_cast<QStyleOptionGroupBox_const*>(opt);
      if (pQVar14 == (QStyleOptionGroupBox *)0x0) {
        pQVar15 = qstyleoption_cast<QStyleOptionTitleBar_const*>(opt);
        if (pQVar15 == (QStyleOptionTitleBar *)0x0) {
          uVar28 = 0;
        }
        else if ((pQVar15->titleBarState & 1U) == 0) {
          uVar28 = (ulong)(pQVar15->titleBarState & 2) << 0x23;
        }
        else {
          uVar28 = 0x800000000;
        }
      }
      else {
        uVar26 = (ulong)(((pQVar14->features).
                          super_QFlagsStorageHelper<QStyleOptionFrame::FrameFeature,_4>.
                          super_QFlagsStorage<QStyleOptionFrame::FrameFeature>.i & 1) << 0x16);
        uVar28 = uVar26 + 0x20000000;
        if (pQVar14->lineWidth != 0) {
          uVar28 = uVar26;
        }
      }
    }
    else {
      uVar28 = (ulong)((pQVar13->frame ^ 1) << 0x1d);
    }
  }
  else {
    if (pseudoElement == 0) {
      QVar24.i = state.i | 4;
      if ((state.i >> 0xd & 1) != 0) {
        QVar24.i = state.i;
      }
      if (((pQVar8->activeSubControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i & 2) != 0) {
        state.i = QVar24.i;
      }
    }
    uVar28 = (ulong)((pQVar12->frame ^ 1) << 0x1d);
    if (pQVar12->editable == false) {
      uVar28 = uVar28 | 0x40000000;
    }
    else {
      uVar28 = uVar28 | 0x8000000000;
    }
  }
LAB_0033e6f2:
  qVar23 = pseudoClass((State)state.i);
  renderRule(__return_storage_ptr__,this,obj,pseudoElement,uVar28 | qVar23);
  return __return_storage_ptr__;
}

Assistant:

QRenderRule QStyleSheetStyle::renderRule(const QObject *obj, const QStyleOption *opt, int pseudoElement) const
{
    quint64 extraClass = 0;
    QStyle::State state = opt ? opt->state : QStyle::State(QStyle::State_None);

    if (const QStyleOptionComplex *complex = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
        if (pseudoElement != PseudoElement_None) {
            // if not an active subcontrol, just pass enabled/disabled
            QStyle::SubControl subControl = knownPseudoElements[pseudoElement].subControl;

            if (!(complex->activeSubControls & subControl))
                state &= (QStyle::State_Enabled | QStyle::State_Horizontal | QStyle::State_HasFocus);
        }

        switch (pseudoElement) {
        case PseudoElement_ComboBoxDropDown:
        case PseudoElement_ComboBoxArrow:
            state |= (complex->state & (QStyle::State_On|QStyle::State_ReadOnly));
            break;
        case PseudoElement_SpinBoxUpButton:
        case PseudoElement_SpinBoxDownButton:
        case PseudoElement_SpinBoxUpArrow:
        case PseudoElement_SpinBoxDownArrow:
#if QT_CONFIG(spinbox)
            if (const QStyleOptionSpinBox *sb = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
                bool on = false;
                bool up = pseudoElement == PseudoElement_SpinBoxUpButton
                          || pseudoElement == PseudoElement_SpinBoxUpArrow;
                if ((sb->stepEnabled & QAbstractSpinBox::StepUpEnabled) && up)
                    on = true;
                else if ((sb->stepEnabled & QAbstractSpinBox::StepDownEnabled) && !up)
                    on = true;
                state |= (on ? QStyle::State_On : QStyle::State_Off);
            }
#endif // QT_CONFIG(spinbox)
            break;
        case PseudoElement_GroupBoxTitle:
            state |= (complex->state & (QStyle::State_MouseOver | QStyle::State_Sunken));
            break;
        case PseudoElement_ToolButtonMenu:
        case PseudoElement_ToolButtonMenuArrow:
        case PseudoElement_ToolButtonMenuIndicator:
            state |= complex->state & QStyle::State_MouseOver;
            if (complex->state & QStyle::State_Sunken ||
                complex->activeSubControls & QStyle::SC_ToolButtonMenu)
                state |= QStyle::State_Sunken;
            break;
        case PseudoElement_SliderGroove:
            state |= complex->state & QStyle::State_MouseOver;
            break;
        default:
            break;
        }

        if (const QStyleOptionComboBox *combo = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            // QStyle::State_On is set when the popup is being shown
            // Propagate EditField Pressed state
            if (pseudoElement == PseudoElement_None
                && (complex->activeSubControls & QStyle::SC_ComboBoxEditField)
                && (!(state & QStyle::State_MouseOver))) {
                state |= QStyle::State_Sunken;
            }

            if (!combo->frame)
                extraClass |= PseudoClass_Frameless;
            if (!combo->editable)
                extraClass |= PseudoClass_ReadOnly;
            else
                extraClass |= PseudoClass_Editable;
#if QT_CONFIG(spinbox)
        } else if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (!spin->frame)
                extraClass |= PseudoClass_Frameless;
#endif // QT_CONFIG(spinbox)
        } else if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            if (gb->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
            if (gb->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
        } else if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            if (tb->titleBarState & Qt::WindowMinimized) {
                extraClass |= PseudoClass_Minimized;
            }
            else if (tb->titleBarState & Qt::WindowMaximized)
                extraClass |= PseudoClass_Maximized;
        }
    } else {
        // handle simple style options
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            if (mi->menuItemType == QStyleOptionMenuItem::DefaultItem)
                extraClass |= PseudoClass_Default;
            if (mi->checkType == QStyleOptionMenuItem::Exclusive)
                extraClass |= PseudoClass_Exclusive;
            else if (mi->checkType == QStyleOptionMenuItem::NonExclusive)
                extraClass |= PseudoClass_NonExclusive;
            if (mi->checkType != QStyleOptionMenuItem::NotCheckable)
                extraClass |= (mi->checked) ? (PseudoClass_On|PseudoClass_Checked)
                                            : (PseudoClass_Off|PseudoClass_Unchecked);
        } else if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            if (hdr->position == QStyleOptionHeader::OnlyOneSection)
                extraClass |= PseudoClass_OnlyOne;
            else if (hdr->position == QStyleOptionHeader::Beginning)
                extraClass |= PseudoClass_First;
            else if (hdr->position == QStyleOptionHeader::End)
                extraClass |= PseudoClass_Last;
            else if (hdr->position == QStyleOptionHeader::Middle)
                extraClass |= PseudoClass_Middle;

            if (hdr->selectedPosition == QStyleOptionHeader::NextAndPreviousAreSelected)
                extraClass |= (PseudoClass_NextSelected | PseudoClass_PreviousSelected);
            else if (hdr->selectedPosition == QStyleOptionHeader::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (hdr->selectedPosition == QStyleOptionHeader::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
#if QT_CONFIG(tabwidget)
        } else if (const QStyleOptionTabWidgetFrame *tab = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif
#if QT_CONFIG(tabbar)
        } else if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
            if (tab->position == QStyleOptionTab::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tab->position == QStyleOptionTab::Beginning)
                extraClass |= PseudoClass_First;
            else if (tab->position == QStyleOptionTab::End)
                extraClass |= PseudoClass_Last;
            else if (tab->position == QStyleOptionTab::Middle)
                extraClass |= PseudoClass_Middle;

            if (tab->selectedPosition == QStyleOptionTab::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tab->selectedPosition == QStyleOptionTab::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;

            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif // QT_CONFIG(tabbar)
        } else if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::Flat)
                extraClass |= PseudoClass_Flat;
            if (btn->features & QStyleOptionButton::DefaultButton)
                extraClass |= PseudoClass_Default;
        } else if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (frm->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
            if (frm->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
        }
#if QT_CONFIG(toolbar)
        else if (const QStyleOptionToolBar *tb = qstyleoption_cast<const QStyleOptionToolBar *>(opt)) {
            if (tb->toolBarArea == Qt::LeftToolBarArea)
                extraClass |= PseudoClass_Left;
            else if (tb->toolBarArea == Qt::RightToolBarArea)
                extraClass |= PseudoClass_Right;
            else if (tb->toolBarArea == Qt::TopToolBarArea)
                extraClass |= PseudoClass_Top;
            else if (tb->toolBarArea == Qt::BottomToolBarArea)
                extraClass |= PseudoClass_Bottom;

            if (tb->positionWithinLine == QStyleOptionToolBar::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->positionWithinLine == QStyleOptionToolBar::Middle)
                extraClass |= PseudoClass_Middle;
            else if (tb->positionWithinLine == QStyleOptionToolBar::End)
                extraClass |= PseudoClass_Last;
            else if (tb->positionWithinLine == QStyleOptionToolBar::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
        }
#endif // QT_CONFIG(toolbar)
#if QT_CONFIG(toolbox)
        else if (const QStyleOptionToolBox *tb = qstyleoption_cast<const QStyleOptionToolBox *>(opt)) {
            if (tb->position == QStyleOptionToolBox::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tb->position == QStyleOptionToolBox::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->position == QStyleOptionToolBox::End)
                extraClass |= PseudoClass_Last;
            else if (tb->position == QStyleOptionToolBox::Middle)
                extraClass |= PseudoClass_Middle;

            if (tb->selectedPosition == QStyleOptionToolBox::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tb->selectedPosition == QStyleOptionToolBox::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
        }
#endif // QT_CONFIG(toolbox)
#if QT_CONFIG(dockwidget)
        else if (const QStyleOptionDockWidget *dw = qstyleoption_cast<const QStyleOptionDockWidget *>(opt)) {
            if (dw->verticalTitleBar)
                extraClass |= PseudoClass_Vertical;
            else
                extraClass |= PseudoClass_Horizontal;
            if (dw->closable)
                extraClass |= PseudoClass_Closable;
            if (dw->floatable)
                extraClass |= PseudoClass_Floatable;
            if (dw->movable)
                extraClass |= PseudoClass_Movable;
        }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(itemviews)
        else if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            if (vopt->features & QStyleOptionViewItem::Alternate)
                extraClass |= PseudoClass_Alternate;
            if (vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Beginning)
                extraClass |= PseudoClass_First;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::End)
                extraClass |= PseudoClass_Last;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Middle)
                extraClass |= PseudoClass_Middle;

        }
#endif
#if QT_CONFIG(textedit)
        else if (const QPlainTextEdit *edit = qobject_cast<const QPlainTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
        else if (const QTextEdit *edit = qobject_cast<const QTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
#endif
#if QT_CONFIG(lineedit)
        // LineEdit sets Sunken flag to indicate Sunken frame (argh)
        if (const QLineEdit *lineEdit = qobject_cast<const QLineEdit *>(obj)) {
            state &= ~QStyle::State_Sunken;
            if (lineEdit->hasFrame()) {
                extraClass &= ~PseudoClass_Frameless;
            } else {
                extraClass |= PseudoClass_Frameless;
            }
        } else
#endif
        if (const QFrame *frm = qobject_cast<const QFrame *>(obj)) {
            if (frm->lineWidth() == 0)
                extraClass |= PseudoClass_Frameless;
        }
    }

    return renderRule(obj, pseudoElement, pseudoClass(state) | extraClass);
}